

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int unqliteReleaseCursor(unqlite *pDb,unqlite_kv_cursor *pCur)

{
  _func_void_unqlite_kv_cursor_ptr *p_Var1;
  sxi32 sVar2;
  
  p_Var1 = ((pDb->sDB).pPager)->pEngine->pIo->pMethods->xCursorRelease;
  if (p_Var1 != (_func_void_unqlite_kv_cursor_ptr *)0x0) {
    (*p_Var1)(pCur);
  }
  sVar2 = SyMemBackendPoolFree(&pDb->sMem,pCur);
  return sVar2;
}

Assistant:

UNQLITE_PRIVATE int unqliteReleaseCursor(unqlite *pDb,unqlite_kv_cursor *pCur)
{
	unqlite_kv_methods *pMethods;
	/* Storage engine methods */
	pMethods = pDb->sDB.pPager->pEngine->pIo->pMethods;
	/* Invoke the release callback if available */
	if( pMethods->xCursorRelease ){
		pMethods->xCursorRelease(pCur);
	}
	/* Finally, free the whole instance */
	SyMemBackendPoolFree(&pDb->sMem,pCur);
	return UNQLITE_OK;
}